

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 07_result.cc
# Opt level: O0

result<std::string,_std::string> *
v2::divide(result<std::string,_std::string> *__return_storage_ptr__,string *s1,string *s2)

{
  ostream *poVar1;
  anon_class_8_1_54a39802 local_b0;
  undefined1 local_a8 [8];
  return_type c;
  undefined1 local_70 [8];
  result<int,_ErrorMsg> b;
  result<int,_ErrorMsg> a;
  string *s2_local;
  string *s1_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)s1);
  poVar1 = std::operator<<(poVar1," / ");
  poVar1 = std::operator<<(poVar1,(string *)s2);
  std::operator<<(poVar1," = ?\n");
  to_int((result<int,_ErrorMsg> *)
         ((long)&b.
                 super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 .
                 super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                 ._value.
                 super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
                 super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_> + 0x20),s1);
  to_int((result<int,_ErrorMsg> *)local_70,s2);
  local_b0.b = (result<int,_ErrorMsg> *)local_70;
  ezy::features::result_interface<ezy::features::result_adapter>::
  impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>>
  ::and_then<v2::divide(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
            ((return_type *)local_a8,
             (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>>
              *)((long)&b.
                        super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        .
                        super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._value.
                        super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
                        super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_> + 0x20),
             &local_b0);
  ezy::features::result_interface<ezy::features::result_adapter>::
  impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>>
  ::map<ezy::to_string_fn_const&>
            (__return_storage_ptr__,
             (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::visitable,ezy::features::result_like_continuation>>
              *)local_a8,(to_string_fn *)&ezy::cpo::to_string);
  ezy::
  strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
  ::~strong_type((strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
                  *)local_a8);
  ezy::
  strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
  ::~strong_type((strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
                  *)local_70);
  ezy::
  strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
  ::~strong_type((strong_type<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void,_ezy::features::visitable,_ezy::features::result_like_continuation>
                  *)((long)&b.
                            super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            .
                            super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ._value.
                            super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
                            super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_> + 0x20)
                );
  return __return_storage_ptr__;
}

Assistant:

ezy::result<std::string, std::string>
  divide(const std::string& s1, const std::string& s2)
  {
    std::cout << s1 << " / " << s2 << " = ?\n";
    const auto a = to_int(s1);
    const auto b = to_int(s2);

    static constexpr auto div = ezy::experimental::curry(std::divides<>{});

    const auto c = a.and_then(
        [&b](auto x) {
          return b.map(div(x));
        }
        );

    return c.map(ezy::to_string);
  }